

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void chacha20_round(chacha20 *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint local_58 [2];
  uint32_t copy [16];
  int i;
  chacha20 *ctx_local;
  
  memcpy(local_58,ctx,0x40);
  for (copy[0xf] = 0; (int)copy[0xf] < 0x14; copy[0xf] = copy[0xf] + 2) {
    uVar1 = copy[2] + local_58[0] ^ copy[10];
    uVar2 = uVar1 << 0x10 | uVar1 >> 0x10;
    uVar3 = uVar2 + copy[6];
    uVar1 = uVar3 ^ copy[2];
    uVar1 = uVar1 << 0xc | uVar1 >> 0x14;
    local_58[0] = uVar1 + copy[2] + local_58[0];
    uVar2 = local_58[0] ^ uVar2;
    uVar4 = uVar2 << 8 | uVar2 >> 0x18;
    uVar3 = uVar4 + uVar3;
    uVar1 = uVar3 ^ uVar1;
    uVar5 = uVar1 << 7 | uVar1 >> 0x19;
    uVar1 = copy[3] + local_58[1] ^ copy[0xb];
    uVar2 = uVar1 << 0x10 | uVar1 >> 0x10;
    uVar6 = uVar2 + copy[7];
    uVar1 = uVar6 ^ copy[3];
    uVar1 = uVar1 << 0xc | uVar1 >> 0x14;
    local_58[1] = uVar1 + copy[3] + local_58[1];
    uVar2 = local_58[1] ^ uVar2;
    uVar7 = uVar2 << 8 | uVar2 >> 0x18;
    uVar6 = uVar7 + uVar6;
    uVar1 = uVar6 ^ uVar1;
    uVar8 = uVar1 << 7 | uVar1 >> 0x19;
    uVar1 = copy[4] + copy[0] ^ copy[0xc];
    uVar2 = uVar1 << 0x10 | uVar1 >> 0x10;
    uVar9 = uVar2 + copy[8];
    uVar1 = uVar9 ^ copy[4];
    uVar1 = uVar1 << 0xc | uVar1 >> 0x14;
    uVar10 = uVar1 + copy[4] + copy[0];
    uVar2 = uVar10 ^ uVar2;
    uVar11 = uVar2 << 8 | uVar2 >> 0x18;
    uVar9 = uVar11 + uVar9;
    uVar1 = uVar9 ^ uVar1;
    uVar12 = uVar1 << 7 | uVar1 >> 0x19;
    uVar1 = copy[5] + copy[1] ^ copy[0xd];
    uVar2 = uVar1 << 0x10 | uVar1 >> 0x10;
    uVar13 = uVar2 + copy[9];
    uVar1 = uVar13 ^ copy[5];
    uVar1 = uVar1 << 0xc | uVar1 >> 0x14;
    uVar14 = uVar1 + copy[5] + copy[1];
    uVar2 = uVar14 ^ uVar2;
    uVar2 = uVar2 << 8 | uVar2 >> 0x18;
    uVar13 = uVar2 + uVar13;
    uVar1 = uVar13 ^ uVar1;
    uVar15 = uVar1 << 7 | uVar1 >> 0x19;
    local_58[0] = uVar8 + local_58[0];
    uVar2 = local_58[0] ^ uVar2;
    uVar1 = uVar2 << 0x10 | uVar2 >> 0x10;
    uVar9 = uVar1 + uVar9;
    uVar8 = uVar9 ^ uVar8;
    uVar2 = uVar8 << 0xc | uVar8 >> 0x14;
    local_58[0] = uVar2 + local_58[0];
    uVar1 = local_58[0] ^ uVar1;
    copy[0xd] = uVar1 << 8 | uVar1 >> 0x18;
    copy[8] = copy[0xd] + uVar9;
    uVar2 = copy[8] ^ uVar2;
    copy[3] = uVar2 << 7 | uVar2 >> 0x19;
    local_58[1] = uVar12 + local_58[1];
    uVar4 = local_58[1] ^ uVar4;
    uVar1 = uVar4 << 0x10 | uVar4 >> 0x10;
    uVar13 = uVar1 + uVar13;
    uVar12 = uVar13 ^ uVar12;
    uVar2 = uVar12 << 0xc | uVar12 >> 0x14;
    local_58[1] = uVar2 + local_58[1];
    uVar1 = local_58[1] ^ uVar1;
    copy[10] = uVar1 << 8 | uVar1 >> 0x18;
    copy[9] = copy[10] + uVar13;
    uVar2 = copy[9] ^ uVar2;
    copy[4] = uVar2 << 7 | uVar2 >> 0x19;
    uVar10 = uVar15 + uVar10;
    uVar7 = uVar10 ^ uVar7;
    uVar1 = uVar7 << 0x10 | uVar7 >> 0x10;
    uVar3 = uVar1 + uVar3;
    uVar15 = uVar3 ^ uVar15;
    uVar2 = uVar15 << 0xc | uVar15 >> 0x14;
    copy[0] = uVar2 + uVar10;
    uVar1 = copy[0] ^ uVar1;
    copy[0xb] = uVar1 << 8 | uVar1 >> 0x18;
    copy[6] = copy[0xb] + uVar3;
    uVar2 = copy[6] ^ uVar2;
    copy[5] = uVar2 << 7 | uVar2 >> 0x19;
    uVar14 = uVar5 + uVar14;
    uVar11 = uVar14 ^ uVar11;
    uVar1 = uVar11 << 0x10 | uVar11 >> 0x10;
    uVar6 = uVar1 + uVar6;
    uVar5 = uVar6 ^ uVar5;
    uVar2 = uVar5 << 0xc | uVar5 >> 0x14;
    copy[1] = uVar2 + uVar14;
    uVar1 = copy[1] ^ uVar1;
    copy[0xc] = uVar1 << 8 | uVar1 >> 0x18;
    copy[7] = copy[0xc] + uVar6;
    uVar2 = copy[7] ^ uVar2;
    copy[2] = uVar2 << 7 | uVar2 >> 0x19;
  }
  for (copy[0xf] = 0; (int)copy[0xf] < 0x10; copy[0xf] = copy[0xf] + 1) {
    local_58[(int)copy[0xf]] = ctx->state[(int)copy[0xf]] + local_58[(int)copy[0xf]];
  }
  for (copy[0xf] = 0; (int)copy[0xf] < 0x10; copy[0xf] = copy[0xf] + 1) {
    ctx->current[(int)(copy[0xf] << 2)] = (uchar)local_58[(int)copy[0xf]];
    ctx->current[(int)(copy[0xf] * 4 + 1)] = (uchar)(local_58[(int)copy[0xf]] >> 8);
    ctx->current[(int)(copy[0xf] * 4 + 2)] = (uchar)(local_58[(int)copy[0xf]] >> 0x10);
    ctx->current[(int)(copy[0xf] * 4 + 3)] = (uchar)(local_58[(int)copy[0xf]] >> 0x18);
  }
  ctx->currentIndex = 0;
  smemclr(local_58,0x40);
  ctx->state[0xc] = ctx->state[0xc] + 1;
  if (ctx->state[0xc] == 0) {
    ctx->state[0xd] = ctx->state[0xd] + 1;
  }
  return;
}

Assistant:

static INLINE void chacha20_round(struct chacha20 *ctx)
{
    int i;
    uint32_t copy[16];

    /* Take a copy */
    memcpy(copy, ctx->state, sizeof(copy));

    /* A circular rotation for a 32bit number */
#define rotl(x, shift) x = ((x << shift) | (x >> (32 - shift)))

    /* What to do for each quarter round operation */
#define qrop(a, b, c, d)                        \
    copy[a] += copy[b];                         \
    copy[c] ^= copy[a];                         \
    rotl(copy[c], d)

    /* A quarter round */
#define quarter(a, b, c, d)                     \
    qrop(a, b, d, 16);                          \
    qrop(c, d, b, 12);                          \
    qrop(a, b, d, 8);                           \
    qrop(c, d, b, 7)

    /* Do 20 rounds, in pairs because every other is different */
    for (i = 0; i < 20; i += 2) {
        /* A round */
        quarter(0, 4, 8, 12);
        quarter(1, 5, 9, 13);
        quarter(2, 6, 10, 14);
        quarter(3, 7, 11, 15);
        /* Another slightly different round */
        quarter(0, 5, 10, 15);
        quarter(1, 6, 11, 12);
        quarter(2, 7, 8, 13);
        quarter(3, 4, 9, 14);
    }

    /* Dump the macros, don't need them littering */
#undef rotl
#undef qrop
#undef quarter

    /* Add the initial state */
    for (i = 0; i < 16; ++i) {
        copy[i] += ctx->state[i];
    }

    /* Update the content of the xor buffer */
    for (i = 0; i < 16; ++i) {
        ctx->current[i * 4 + 0] = copy[i] >> 0;
        ctx->current[i * 4 + 1] = copy[i] >> 8;
        ctx->current[i * 4 + 2] = copy[i] >> 16;
        ctx->current[i * 4 + 3] = copy[i] >> 24;
    }
    /* State full, reset pointer to beginning */
    ctx->currentIndex = 0;
    smemclr(copy, sizeof(copy));

    /* Increment round counter */
    ++ctx->state[12];
    /* Check for overflow, not done in one line so the 32 bits are chopped by the type */
    if (!(uint32_t)(ctx->state[12])) {
        ++ctx->state[13];
    }
}